

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O0

int SetPWMPololu(POLOLU *pPololu,int channel,int pw)

{
  int iVar1;
  int local_244;
  int local_240;
  int local_23c;
  int sendbuflen;
  int target;
  uchar sendbuf [512];
  int local_20;
  int pw_local;
  int channel_local;
  POLOLU *pPololu_local;
  
  if (pPololu->bProportionalPWs[channel] == 0) {
    local_20 = (int)(pPololu->CoefPWs[channel] * (double)(pw + -0x5dc)) + 0x5dc;
  }
  else {
    iVar1 = (int)(pPololu->CoefPWs[channel] * (double)(pw + -0x5dc));
    if (iVar1 < 0) {
      local_20 = pPololu->MidPWs[channel] +
                 (iVar1 * (pPololu->MinPWs[channel] - pPololu->MidPWs[channel])) / -500;
    }
    else {
      local_20 = pPololu->MidPWs[channel] +
                 (iVar1 * (pPololu->MaxPWs[channel] - pPololu->MidPWs[channel])) / 500;
    }
  }
  if (local_20 < pPololu->MaxPWs[channel]) {
    local_23c = local_20;
  }
  else {
    local_23c = pPololu->MaxPWs[channel];
  }
  if (pPololu->MinPWs[channel] < local_23c) {
    if (local_20 < pPololu->MaxPWs[channel]) {
      local_240 = local_20;
    }
    else {
      local_240 = pPololu->MaxPWs[channel];
    }
    local_244 = local_240;
  }
  else {
    local_244 = pPololu->MinPWs[channel];
  }
  iVar1 = local_244 - pPololu->LastPWs[channel];
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (iVar1 < pPololu->ThresholdPWs[channel]) {
    pPololu_local._4_4_ = 0;
  }
  else {
    memset(&sendbuflen,0,0x200);
    sendbuflen._0_1_ = 0xaa;
    sendbuflen._1_1_ = (undefined1)pPololu->DeviceNumber;
    sendbuflen._2_1_ = 4;
    sendbuflen._3_1_ = (undefined1)channel;
    target._0_1_ = (byte)(local_244 << 2) & 0x7f;
    target._1_1_ = (byte)((local_244 << 2) >> 7) & 0x7f;
    iVar1 = WriteAllRS232Port(&pPololu->RS232Port,(uint8 *)&sendbuflen,6);
    if (iVar1 == 0) {
      if ((pPololu->bSaveRawData != 0) && (pPololu->pfSaveFile != (FILE *)0x0)) {
        fwrite(&sendbuflen,6,1,(FILE *)pPololu->pfSaveFile);
        fflush((FILE *)pPololu->pfSaveFile);
      }
      pPololu->LastPWs[channel] = local_244;
      pPololu_local._4_4_ = 0;
    }
    else {
      pPololu_local._4_4_ = 1;
    }
  }
  return pPololu_local._4_4_;
}

Assistant:

inline int SetPWMPololu(POLOLU* pPololu, int channel, int pw)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	int target = 0;
	int sendbuflen = 0;

	if (pPololu->bProportionalPWs[channel])
	{
		pw = (int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
		if (pw >= 0)
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
		else
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
	}
	else
	{
		pw = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
	}

	pw = max(min(pw, pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
	//pw = max(min(pw, DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

	// The requested PWM is only applied if it is slightly different from the current value.
	if (abs(pw-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) return EXIT_SUCCESS;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
	sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
	sendbuf[2] = (unsigned char)(SET_TARGET_COMMAND_POLOLU & 0x7F);
	sendbuf[3] = (unsigned char)channel;
	target = pw*4;
	sendbuf[4] = (unsigned char)(target & 0x7F);
	sendbuf[5] = (unsigned char)((target >> 7) & 0x7F);
	sendbuflen = 6;

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	// Update last known value.
	pPololu->LastPWs[channel] = pw;

	return EXIT_SUCCESS;
}